

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O1

int32 __thiscall rw::HAnimHierarchy::getIndex(HAnimHierarchy *this,int32 id)

{
  long lVar1;
  HAnimNodeInfo *pHVar2;
  
  if (0 < (long)this->numNodes) {
    pHVar2 = this->nodeInfo;
    lVar1 = 0;
    do {
      if (pHVar2->id == id) {
        return (int32)lVar1;
      }
      lVar1 = lVar1 + 1;
      pHVar2 = pHVar2 + 1;
    } while (this->numNodes != lVar1);
  }
  return -1;
}

Assistant:

int32
HAnimHierarchy::getIndex(int32 id)
{
	for(int32 i = 0; i < this->numNodes; i++)
		if(this->nodeInfo[i].id == id)
			return i;
	return -1;
}